

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

int Cec3_ManSolveTwo(Cec3_Man_t *p,int iObj0,int iObj1,int fPhase)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  Gia_Obj_t *pGVar5;
  int Lits [2];
  
  Lits[1] = (int)((ulong)in_RAX >> 0x20);
  iVar4 = iObj0;
  if (iObj0 < iObj1) {
    iVar4 = iObj1;
  }
  if (iObj1 < iObj0) {
    iObj0 = iObj1;
  }
  if (iVar4 <= iObj0) {
    __assert_fail("iObj0 < iObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32d,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  if ((p->pPars->fUseCones == 0) && (iVar2 = bmcg_sat_solver_varnum(p->pSat), iVar2 != 0)) {
    __assert_fail("p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,0x32e,"int Cec3_ManSolveTwo(Cec3_Man_t *, int, int, int)");
  }
  if ((iObj0 == 0) && (iVar2 = Cec3_ObjSatId(p->pNew,p->pNew->pObjs), iVar2 == -1)) {
    pGVar1 = p->pNew;
    pGVar5 = pGVar1->pObjs;
    iVar2 = bmcg_sat_solver_addvar(p->pSat);
    Cec3_ObjSetSatId(pGVar1,pGVar5,iVar2);
  }
  iVar2 = Cec3_ObjGetCnfVar(p,iObj0);
  iVar3 = Cec3_ObjGetCnfVar(p,iVar4);
  p->vNodesNew->nSize = 0;
  p->vSatVars->nSize = 0;
  p->vObjSatPairs->nSize = 0;
  Gia_ManIncrementTravId(p->pNew);
  Cec3_ManCollect_rec(p,iObj0);
  Cec3_ManCollect_rec(p,iVar4);
  Lits[0] = Abc_Var2Lit(iVar2,1);
  iVar4 = Abc_Var2Lit(iVar3,fPhase);
  Lits[1] = iVar4;
  bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
  iVar4 = bmcg_sat_solver_solve(p->pSat,Lits,2);
  if (0 < iObj0 && iVar4 == -1) {
    iVar4 = Abc_Var2Lit(iVar2,0);
    Lits[0] = iVar4;
    iVar4 = Abc_Var2Lit(iVar3,(uint)(fPhase == 0));
    Lits[1] = iVar4;
    bmcg_sat_solver_set_conflict_budget(p->pSat,p->pPars->nConfLimit);
    iVar4 = bmcg_sat_solver_solve(p->pSat,Lits,2);
  }
  if (p->pPars->fUseCones == 0) {
    for (iVar2 = 0; iVar2 < p->vNodesNew->nSize; iVar2 = iVar2 + 1) {
      pGVar1 = p->pNew;
      iVar3 = Vec_IntEntry(p->vNodesNew,iVar2);
      pGVar5 = Gia_ManObj(pGVar1,iVar3);
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return iVar4;
      }
      pGVar1 = p->pNew;
      iVar3 = Cec3_ObjSatId(pGVar1,pGVar5);
      if (iVar3 == -1) {
        __assert_fail("Cec3_ObjSatId(p, pObj) != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                      ,0x4e,"void Cec3_ObjCleanSatId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar3 = Gia_ObjId(pGVar1,pGVar5);
      Gia_ObjSetCopy2Array(pGVar1,iVar3,-1);
    }
  }
  return iVar4;
}

Assistant:

int Cec3_ManSolveTwo( Cec3_Man_t * p, int iObj0, int iObj1, int fPhase )
{
    Gia_Obj_t * pObj;
    int status, i, iVar0, iVar1, Lits[2];
    if (iObj1 < iObj0) 
        iObj1 ^= iObj0, iObj0 ^= iObj1, iObj1 ^= iObj0;
    assert( iObj0 < iObj1 );
    assert( p->pPars->fUseCones || bmcg_sat_solver_varnum(p->pSat) == 0 );
    if ( !iObj0 && Cec3_ObjSatId(p->pNew, Gia_ManConst0(p->pNew)) == -1 )
        Cec3_ObjSetSatId( p->pNew, Gia_ManConst0(p->pNew), bmcg_sat_solver_addvar(p->pSat) );
    iVar0 = Cec3_ObjGetCnfVar( p, iObj0 );
    iVar1 = Cec3_ObjGetCnfVar( p, iObj1 );
    // collect inputs and internal nodes
    Vec_IntClear( p->vNodesNew );
    Vec_IntClear( p->vSatVars );
    Vec_IntClear( p->vObjSatPairs );
    Gia_ManIncrementTravId( p->pNew );
    Cec3_ManCollect_rec( p, iObj0 );
    Cec3_ManCollect_rec( p, iObj1 );
//printf( "%d ", Vec_IntSize(p->vNodesNew) );
    // solve direct
    if ( p->pPars->fUseCones )  satoko_mark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 1) );
//    satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, fPhase) );
//    status = satoko_solve( p->pSat );
//    satoko_assump_pop( p->pSat );
//    satoko_assump_pop( p->pSat );
    Lits[0] = Abc_Var2Lit(iVar0, 1);
    Lits[1] = Abc_Var2Lit(iVar1, fPhase);
    bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
    status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    if ( status == GLUCOSE_UNSAT && iObj0 > 0 )
    {
        // solve reverse
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar0, 0) );
//        satoko_assump_push( p->pSat, Abc_Var2Lit(iVar1, !fPhase) );
//        status = satoko_solve( p->pSat );
//        satoko_assump_pop( p->pSat );
//        satoko_assump_pop( p->pSat );
        Lits[0] = Abc_Var2Lit(iVar0, 0);
        Lits[1] = Abc_Var2Lit(iVar1, !fPhase);
        bmcg_sat_solver_set_conflict_budget( p->pSat, p->pPars->nConfLimit );
        status = bmcg_sat_solver_solve( p->pSat, Lits, 2 );
    }
    if ( p->pPars->fUseCones )  satoko_unmark_cone( p->pSat, Vec_IntArray(p->vSatVars), Vec_IntSize(p->vSatVars) );
    //if ( status == SATOKO_SAT )
    //    Cec3_ManVerify( p->pNew, iObj0, iObj1, fPhase, p->pSat );
    if ( p->pPars->fUseCones )
        return status;
    Gia_ManForEachObjVec( p->vNodesNew, p->pNew, pObj, i )
        Cec3_ObjCleanSatId( p->pNew, pObj );
    return status;
}